

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall cmGlobalUnixMakefileGenerator3::Generate(cmGlobalUnixMakefileGenerator3 *this)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  cmGeneratedFileStream *pcVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  string *psVar6;
  ostream *poVar7;
  pointer puVar8;
  iterator __end1;
  iterator __begin1;
  unsigned_long total;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  unsigned_long current;
  string markFileName;
  cmGeneratedFileStream markFile;
  unsigned_long local_2c0;
  string local_2b8;
  basic_string_view<char,_std::char_traits<char>_> local_298;
  undefined8 local_288;
  char *local_280;
  
  cmGlobalGenerator::Generate((cmGlobalGenerator *)this);
  p_Var1 = &(this->ProgressMap)._M_t._M_impl.super__Rb_tree_header;
  total = 0;
  p_Var5 = (this->ProgressMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var4 = p_Var5; (_Rb_tree_header *)p_Var4 != p_Var1;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    total = (long)&(p_Var4[1]._M_parent)->_M_color + total;
  }
  local_2c0 = 0;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      TargetProgress::WriteProgressVariables
                ((TargetProgress *)&p_Var5[1]._M_parent,total,&local_2c0);
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  puVar8 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 != puVar2) {
    do {
      psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                         ((puVar8->_M_t).
                          super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                          .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
      local_298._M_str = (psVar6->_M_dataplus)._M_p;
      local_298._M_len = psVar6->_M_string_length;
      local_288 = 0x1a;
      local_280 = "/CMakeFiles/progress.marks";
      views._M_len = 2;
      views._M_array = &local_298;
      cmCatViews_abi_cxx11_(&local_2b8,views);
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)&local_298,&local_2b8,false,None);
      CountProgressMarksInAll
                (this,(puVar8->_M_t).
                      super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                      .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&local_298);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar2);
  }
  WriteMainMakefile2(this);
  WriteMainCMakefile(this);
  pcVar3 = (this->CommandDatabase)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  if (pcVar3 != (cmGeneratedFileStream *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar3,"\n]",2);
    pcVar3 = (this->CommandDatabase)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    (this->CommandDatabase)._M_t.
    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
    super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
         (cmGeneratedFileStream *)0x0;
    if (pcVar3 != (cmGeneratedFileStream *)0x0) {
      (**(code **)(*(long *)&(pcVar3->super_ofstream).
                             super_basic_ostream<char,_std::char_traits<char>_> + 8))();
    }
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::Generate()
{
  // first do superclass method
  this->cmGlobalGenerator::Generate();

  // initialize progress
  unsigned long total = 0;
  for (auto const& pmi : this->ProgressMap) {
    total += pmi.second.NumberOfActions;
  }

  // write each target's progress.make this loop is done twice. Basically the
  // Generate pass counts all the actions, the first loop below determines
  // how many actions have progress updates for each target and writes to
  // correct variable values for everything except the all targets. The
  // second loop actually writes out correct values for the all targets as
  // well. This is because the all targets require more information that is
  // computed in the first loop.
  unsigned long current = 0;
  for (auto& pmi : this->ProgressMap) {
    pmi.second.WriteProgressVariables(total, current);
  }
  for (const auto& lg : this->LocalGenerators) {
    std::string markFileName =
      cmStrCat(lg->GetCurrentBinaryDirectory(), "/CMakeFiles/progress.marks");
    cmGeneratedFileStream markFile(markFileName);
    markFile << this->CountProgressMarksInAll(*lg) << "\n";
  }

  // write the main makefile
  this->WriteMainMakefile2();
  this->WriteMainCMakefile();

  if (this->CommandDatabase) {
    *this->CommandDatabase << "\n]";
    this->CommandDatabase.reset();
  }
}